

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O2

void __thiscall duckdb::LoadCommand::ExecuteInternal(LoadCommand *this,ExecuteContext *context)

{
  pointer pDVar1;
  pointer this_00;
  DatabaseInstance *pDVar2;
  DBConfig DVar3;
  unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true> *this_01;
  SQLLogicTestRunner *pSVar4;
  string resolved_path;
  string local_88 [32];
  string local_68;
  string local_48;
  
  pSVar4 = (this->super_Command).runner;
  std::__cxx11::string::string((string *)&local_48,(string *)&this->dbpath);
  SQLLogicTestRunner::LoopReplacement(&resolved_path,pSVar4,&local_48,&context->running_loops);
  std::__cxx11::string::~string((string *)&local_48);
  if (this->readonly == false) {
    std::__cxx11::string::string((string *)&local_68,(string *)&resolved_path);
    DeleteDatabase(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::_M_assign((string *)&((this->super_Command).runner)->dbpath);
  this_01 = &((this->super_Command).runner)->config;
  if (this->readonly == true) {
    pDVar1 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_01);
    pDVar1[0x148] = (DBConfig)0x0;
    pDVar1 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    DVar3 = (DBConfig)0x2;
  }
  else {
    pDVar1 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (this_01);
    pDVar1[0x148] = (DBConfig)0x1;
    pDVar1 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    DVar3 = (DBConfig)0x1;
  }
  pDVar1[0xd0] = DVar3;
  pSVar4 = (this->super_Command).runner;
  if ((pSVar4->db).super_unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super___uniq_ptr_impl<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DuckDB_*,_std::default_delete<duckdb::DuckDB>_>.
      super__Head_base<0UL,_duckdb::DuckDB_*,_false>._M_head_impl != (DuckDB *)0x0) {
    this_00 = unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator->
                        (&pSVar4->db);
    pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->
                       ((shared_ptr<duckdb::DatabaseInstance,_true> *)this_00);
    pDVar1 = unique_ptr<duckdb::DBConfig,_std::default_delete<duckdb::DBConfig>,_true>::operator->
                       (&((this->super_Command).runner)->config);
    SerializationCompatibility::operator=
              ((SerializationCompatibility *)(pDVar1 + 0x208),
               (SerializationCompatibility *)(pDVar2 + 0x218));
    pSVar4 = (this->super_Command).runner;
  }
  std::__cxx11::string::string(local_88,(string *)&resolved_path);
  (**pSVar4->_vptr_SQLLogicTestRunner)(pSVar4,local_88,1);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&resolved_path);
  return;
}

Assistant:

void LoadCommand::ExecuteInternal(ExecuteContext &context) const {
	auto resolved_path = runner.LoopReplacement(dbpath, context.running_loops);
	if (!readonly) {
		// delete the target database file, if it exists
		DeleteDatabase(resolved_path);
	}
	runner.dbpath = resolved_path;

	// set up the config file
	if (readonly) {
		runner.config->options.use_temporary_directory = false;
		runner.config->options.access_mode = AccessMode::READ_ONLY;
	} else {
		runner.config->options.use_temporary_directory = true;
		runner.config->options.access_mode = AccessMode::AUTOMATIC;
	}
	if (runner.db) {
		runner.config->options.serialization_compatibility =
		    runner.db->instance->config.options.serialization_compatibility;
	}
	// now create the database file
	runner.LoadDatabase(resolved_path, true);
}